

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-magic.c
# Opt level: O2

_Bool borg_spell(borg_spells spell)

{
  short sVar1;
  _Bool _Var2;
  wchar_t wVar3;
  char *what;
  borg_magic *pbVar4;
  
  wVar3 = borg_get_spell_number(spell);
  if (L'\xffffffff' < wVar3) {
    pbVar4 = borg_magics + (uint)wVar3;
    _Var2 = borg_spell_okay(spell);
    if ((_Var2) && (sVar1 = borg.book_idx[pbVar4->book], -1 < sVar1)) {
      what = format("# Casting %s (%d,%d).",pbVar4->name,(ulong)(uint)(int)sVar1,
                    (ulong)(uint)pbVar4->book_offset);
      borg_note(what);
      borg_keypress(0x6d);
      borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[(int)sVar1]);
      borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[pbVar4->book_offset]);
      pbVar4->times = pbVar4->times + 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool borg_spell(const enum borg_spells spell)
{
    int i;

    int spell_num = borg_get_spell_number(spell);
    if (spell_num < 0)
        return false;

    borg_magic *as = &borg_magics[spell_num];

    /* Require ability (right now) */
    if (!borg_spell_okay(spell))
        return false;

    /* Look for the book */
    i = borg.book_idx[as->book];

    /* Paranoia */
    if (i < 0)
        return false;

    /* Debugging Info */
    borg_note(format("# Casting %s (%d,%d).", as->name, i, as->book_offset));

    /* Cast a spell */
    borg_keypress('m');
    borg_keypress(all_letters_nohjkl[i]);
    borg_keypress(all_letters_nohjkl[as->book_offset]);

    /* increment the spell counter */
    as->times++;

    /* Success */
    return true;
}